

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall
Saturation::SaturationAlgorithm::handleEmptyClause(SaturationAlgorithm *this,Clause *cl)

{
  bool bVar1;
  undefined8 *puVar2;
  
  bVar1 = Kernel::MainLoop::isRefutation(cl);
  if (!bVar1) {
    Splitter::handleEmptyClause(this->_splitter,cl);
    return;
  }
  onNonRedundantClause(this,cl);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = cl;
  __cxa_throw(puVar2,&Kernel::MainLoop::RefutationFoundException::typeinfo,0);
}

Assistant:

void SaturationAlgorithm::handleEmptyClause(Clause* cl)
{
  ASS(cl->isEmpty());

  if (isRefutation(cl)) {
    onNonRedundantClause(cl);

    throw RefutationFoundException(cl);
  }
  // as Clauses no longer have prop parts the only reason for an empty
  // clause not being a refutation is if it has splits

  if (_splitter && _splitter->handleEmptyClause(cl)) {
    return;
  }

  // splitter should only return false if splits isEmpty, which it cannot be
  ASSERTION_VIOLATION;
  // removed some code that dealt with the case where a clause is empty
  // but as a non-empty bdd prop part
}